

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

HelicsTranslator
coreAddTranslator(HelicsCore core,
                 unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *trans)

{
  bool bVar1;
  pointer pTVar2;
  __normal_iterator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_*,_std::vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>_>
  *__i;
  vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
  *in_RSI;
  long in_RDI;
  __normal_iterator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_*,_std::vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>_>
  ind;
  HelicsTranslator hTrans;
  CoreObject *coreObj;
  vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
  *in_stack_ffffffffffffff88;
  const_iterator __position;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar3;
  BaseType local_44;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *local_40;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *local_38;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *local_30;
  BaseType local_28;
  InterfaceHandle local_24;
  pointer local_20;
  long local_18;
  
  __position._M_current =
       (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *)
       in_RSI;
  local_18 = in_RDI;
  pTVar2 = std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
           ::operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1ebb7f);
  pTVar2->valid = -0x4c83cad2;
  local_20 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             get((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                  *)in_RSI);
  bVar1 = std::
          vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
          ::empty((vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar3 = true;
  if (!bVar1) {
    pTVar2 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1ebbba);
    local_24 = helics::Interface::getHandle(&pTVar2->transPtr->super_Interface);
    std::
    vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ::back(in_RSI);
    pTVar2 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1ebbdd);
    local_28 = (BaseType)helics::Interface::getHandle(&pTVar2->transPtr->super_Interface);
    bVar3 = helics::InterfaceHandle::operator>(&local_24,(InterfaceHandle)local_28);
  }
  if (bVar3 == false) {
    local_38 = (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)std::
                  vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                  ::begin(in_stack_ffffffffffffff88);
    local_40 = (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)std::
                  vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                  ::end(in_stack_ffffffffffffff88);
    pTVar2 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1ebc4e);
    local_44 = (BaseType)helics::Interface::getHandle(&pTVar2->transPtr->super_Interface);
    local_30 = (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)std::
                  upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>*,std::vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>>,helics::InterfaceHandle,__0>
                            (local_38,local_40,&local_44);
    __i = (__normal_iterator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_*,_std::vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>_>
           *)(local_18 + 0x28);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>const*,std::vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>>
    ::
    __normal_iterator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>*>
              ((__normal_iterator<const_std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_*,_std::vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>_>
                *)in_RSI,__i);
    std::
    vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ::insert(in_RSI,__position,(value_type *)__i);
  }
  else {
    std::
    vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ::push_back(in_RSI,(value_type *)in_stack_ffffffffffffff88);
  }
  return local_20;
}

Assistant:

static inline HelicsTranslator coreAddTranslator(HelicsCore core, std::unique_ptr<helics::TranslatorObject> trans)
{
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    trans->valid = translatorValidationIdentifier;
    HelicsTranslator hTrans = trans.get();
    if (coreObj->translators.empty() || trans->transPtr->getHandle() > coreObj->translators.back()->transPtr->getHandle()) {
        coreObj->translators.push_back(std::move(trans));
    } else {
        auto ind =
            std::upper_bound(coreObj->translators.begin(), coreObj->translators.end(), trans->transPtr->getHandle(), translatorSearch);
        coreObj->translators.insert(ind, std::move(trans));
    }

    return hTrans;
}